

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Sat(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Vec_Ptr_t *vCexes;
  bool bVar1;
  bool bVar2;
  int iVar3;
  Vec_Int_t *p;
  Gia_Man_t *pGVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  Vec_Str_t *vStatus;
  Cec_ParSat_t ParsSat;
  
  Cec_ManSatSetDefaultParams(&ParsSat);
  bVar2 = false;
  Extra_UtilGetoptReset();
  bVar1 = false;
LAB_0024d845:
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"CSNanmtcxvh");
    iVar5 = globalUtilOptind;
    switch(iVar3) {
    case 0x6d:
      ParsSat.fCheckMiter = ParsSat.fCheckMiter ^ 1;
      goto LAB_0024d845;
    case 0x6e:
      ParsSat.fNonChrono = ParsSat.fNonChrono ^ 1;
      goto LAB_0024d845;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x73:
    case 0x75:
    case 0x77:
      goto switchD_0024d88a_caseD_6f;
    case 0x74:
      ParsSat.fLearnCls = ParsSat.fLearnCls ^ 1;
      goto LAB_0024d845;
    case 0x76:
      ParsSat.fVerbose = ParsSat.fVerbose ^ 1;
      goto LAB_0024d845;
    case 0x78:
      bVar2 = (bool)(bVar2 ^ 1);
      goto LAB_0024d845;
    }
    if (iVar3 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0024d970:
        Abc_Print(-1,pcVar6);
        goto switchD_0024d88a_caseD_6f;
      }
      iVar3 = atoi(argv[globalUtilOptind]);
      ParsSat.nBTLimit = iVar3;
    }
    else if (iVar3 == 0x4e) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-N\" should be followed by an integer.\n";
        goto LAB_0024d970;
      }
      iVar3 = atoi(argv[globalUtilOptind]);
      ParsSat.nCallsRecycle = iVar3;
    }
    else {
      if (iVar3 != 0x53) {
        if (iVar3 == 0x61) {
          ParsSat.fSaveCexes = ParsSat.fSaveCexes ^ 1;
        }
        else {
          if (iVar3 != 99) {
            if (iVar3 == -1) {
              pGVar4 = pAbc->pGia;
              if (pGVar4 != (Gia_Man_t *)0x0) {
                if (bVar1) {
                  if (bVar2) {
                    p = Cbs2_ManSolveMiterNc(pGVar4,ParsSat.nBTLimit,&vStatus,ParsSat.fVerbose);
                  }
                  else if (ParsSat.fLearnCls == 0) {
                    if (ParsSat.fNonChrono == 0) {
                      p = Cbs_ManSolveMiter(pGVar4,ParsSat.nBTLimit,&vStatus,ParsSat.fVerbose);
                    }
                    else {
                      p = Cbs_ManSolveMiterNc(pGVar4,ParsSat.nBTLimit,&vStatus,ParsSat.fVerbose);
                    }
                  }
                  else {
                    p = Tas_ManSolveMiterNc(pGVar4,ParsSat.nBTLimit,&vStatus,ParsSat.fVerbose);
                  }
                  Vec_IntFree(p);
                  Vec_StrFree(vStatus);
                }
                else {
                  pGVar4 = Cec_ManSatSolving(pGVar4,&ParsSat);
                  Abc_FrameUpdateGia(pAbc,pGVar4);
                }
                vCexes = pAbc->pGia->vSeqModelVec;
                if (vCexes == (Vec_Ptr_t *)0x0) {
                  return 0;
                }
                vStatus = (Vec_Str_t *)Abc_FrameDeriveStatusArray2(vCexes);
                Abc_FrameReplacePoStatuses(pAbc,(Vec_Int_t **)&vStatus);
                Abc_FrameReplaceCexVec(pAbc,&pAbc->pGia->vSeqModelVec);
                return 0;
              }
              pcVar6 = "Abc_CommandAbc9Sat(): There is no AIG.\n";
              iVar5 = -1;
              goto LAB_0024dabf;
            }
            goto switchD_0024d88a_caseD_6f;
          }
          bVar1 = (bool)(bVar1 ^ 1);
        }
        goto LAB_0024d845;
      }
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-S\" should be followed by an integer.\n";
        goto LAB_0024d970;
      }
      iVar3 = atoi(argv[globalUtilOptind]);
      ParsSat.nSatVarMax = iVar3;
    }
    globalUtilOptind = iVar5 + 1;
    if (iVar3 < 0) {
switchD_0024d88a_caseD_6f:
      iVar5 = -2;
      Abc_Print(-2,"usage: &sat [-CSN <num>] [-anmctxvh]\n");
      Abc_Print(-2,"\t         performs SAT solving for the combinational outputs\n");
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)ParsSat.nBTLimit);
      Abc_Print(-2,"\t-S num : the min number of variables to recycle the solver [default = %d]\n",
                (ulong)(uint)ParsSat.nSatVarMax);
      Abc_Print(-2,"\t-N num : the min number of calls to recycle the solver [default = %d]\n",
                (ulong)(uint)ParsSat.nCallsRecycle);
      pcVar7 = "yes";
      pcVar6 = "yes";
      if (ParsSat.fSaveCexes == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,
                "\t-a     : toggle solving all outputs and saving counter-examples [default = %s]\n"
                ,pcVar6);
      pcVar6 = "yes";
      if (ParsSat.fNonChrono == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-n     : toggle using non-chronological backtracking [default = %s]\n",pcVar6)
      ;
      pcVar6 = "miter";
      if (ParsSat.fCheckMiter == 0) {
        pcVar6 = "circuit";
      }
      Abc_Print(-2,"\t-m     : toggle miter vs. any circuit [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (!bVar1) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle using circuit-based SAT solver [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (ParsSat.fLearnCls == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle using learning in curcuit-based solver [default = %s]\n",
                pcVar6);
      pcVar6 = "yes";
      if (!bVar2) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-x     : toggle using new solver [default = %s]\n",pcVar6);
      if (ParsSat.fVerbose == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar7);
      pcVar6 = "\t-h     : print the command usage\n";
LAB_0024dabf:
      Abc_Print(iVar5,pcVar6);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Sat( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Vec_Int_t * Cbs2_ManSolveMiterNc( Gia_Man_t * pAig, int nConfs, Vec_Str_t ** pvStatus, int fVerbose );
    Cec_ParSat_t ParsSat, * pPars = &ParsSat;
    Gia_Man_t * pTemp;
    int c;
    int fNewSolver = 0, fCSat = 0;
    Cec_ManSatSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CSNanmtcxvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nSatVarMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nSatVarMax < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nCallsRecycle = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCallsRecycle < 0 )
                goto usage;
            break;
        case 'a':
            pPars->fSaveCexes ^= 1;
            break;
        case 'n':
            pPars->fNonChrono ^= 1;
            break;
        case 'm':
            pPars->fCheckMiter ^= 1;
            break;
        case 't':
            pPars->fLearnCls ^= 1;
            break;
        case 'c':
            fCSat ^= 1;
            break;
        case 'x':
            fNewSolver ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Sat(): There is no AIG.\n" );
        return 1;
    }
    if ( fCSat )
    {
        Vec_Int_t * vCounters;
        Vec_Str_t * vStatus;
        if ( fNewSolver )
            vCounters = Cbs2_ManSolveMiterNc( pAbc->pGia, pPars->nBTLimit, &vStatus, pPars->fVerbose );
        else if ( pPars->fLearnCls )
            vCounters = Tas_ManSolveMiterNc( pAbc->pGia, pPars->nBTLimit, &vStatus, pPars->fVerbose );
        else if ( pPars->fNonChrono )
            vCounters = Cbs_ManSolveMiterNc( pAbc->pGia, pPars->nBTLimit, &vStatus, pPars->fVerbose );
        else
            vCounters = Cbs_ManSolveMiter( pAbc->pGia, pPars->nBTLimit, &vStatus, pPars->fVerbose );
        Vec_IntFree( vCounters );
        Vec_StrFree( vStatus );
    }
    else
    {
        pTemp = Cec_ManSatSolving( pAbc->pGia, pPars );
        Abc_FrameUpdateGia( pAbc, pTemp );
    }
    if ( pAbc->pGia->vSeqModelVec )
    {
        Vec_Int_t * vStatuses = Abc_FrameDeriveStatusArray2( pAbc->pGia->vSeqModelVec );
        Abc_FrameReplacePoStatuses( pAbc, &vStatuses );
        Abc_FrameReplaceCexVec( pAbc, &pAbc->pGia->vSeqModelVec );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &sat [-CSN <num>] [-anmctxvh]\n" );
    Abc_Print( -2, "\t         performs SAT solving for the combinational outputs\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-S num : the min number of variables to recycle the solver [default = %d]\n", pPars->nSatVarMax );
    Abc_Print( -2, "\t-N num : the min number of calls to recycle the solver [default = %d]\n", pPars->nCallsRecycle );
    Abc_Print( -2, "\t-a     : toggle solving all outputs and saving counter-examples [default = %s]\n", pPars->fSaveCexes? "yes": "no" );
    Abc_Print( -2, "\t-n     : toggle using non-chronological backtracking [default = %s]\n", pPars->fNonChrono? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle miter vs. any circuit [default = %s]\n", pPars->fCheckMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-c     : toggle using circuit-based SAT solver [default = %s]\n", fCSat? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle using learning in curcuit-based solver [default = %s]\n", pPars->fLearnCls? "yes": "no" );
    Abc_Print( -2, "\t-x     : toggle using new solver [default = %s]\n", fNewSolver? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}